

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O1

int main(void)

{
  long lVar1;
  uint i;
  long lVar2;
  int type;
  int64_t sizes [1000];
  int64_t local_1f58;
  long alStack_1f50 [1000];
  
  srand48(0x2a);
  lVar2 = 0;
  do {
    lVar1 = lrand48();
    alStack_1f50[lVar2 + -1] = lVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 1000);
  lVar2 = 0;
  do {
    alStack_1f50[lVar2 + -1] =
         (long)((double)alStack_1f50[lVar2 + -1] * 4.656612873077393e-10 * 42000.0) + 1;
    alStack_1f50[lVar2] = (long)((double)alStack_1f50[lVar2] * 4.656612873077393e-10 * 42000.0) + 1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 1000);
  alStack_1f50[0x3e6] = 42000;
  type = 0;
  do {
    run_tests(&local_1f58,1000,type);
    type = type + 1;
  } while (type != 0x15);
  return 0;
}

Assistant:

int main(void) {
  int i = 0;
  int64_t sizes[TESTS];
  srand48(SEED);
  // stable_tests();
  fill_random(sizes, TESTS);

  for (i = 0; i < TESTS; i++) {
    RAND_RANGE(sizes[i], 1, MAXSIZE);
  }

  sizes[TESTS - 1] = MAXSIZE;

  for (i = 0; i < FILL_LAST_ELEMENT; i++) {
    int result = run_tests(sizes, TESTS, i);

    if (result) {
      return 1;
    }
  }

  return 0;
}